

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jasmin.cpp
# Opt level: O0

void __thiscall Oric::Jasmin::set_motor_on(Jasmin *this,bool on)

{
  Observer *pOVar1;
  Drive *this_00;
  allocator<char> local_39;
  string local_38 [39];
  byte local_11;
  Jasmin *pJStack_10;
  bool on_local;
  Jasmin *this_local;
  
  (this->super_DiskController).field_0x4e4 = on;
  local_11 = on;
  pJStack_10 = this;
  this_00 = Storage::Disk::Controller::get_drive((Controller *)this);
  Storage::Disk::Drive::set_motor_on(this_00,(bool)((this->super_DiskController).field_0x4e4 & 1));
  if (this->observer_ != (Observer *)0x0) {
    pOVar1 = this->observer_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"Jasmin",&local_39);
    (*pOVar1->_vptr_Observer[4])(pOVar1,local_38,(ulong)(local_11 & 1));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void Jasmin::set_motor_on(bool on) {
	motor_on_ = on;
	get_drive().set_motor_on(motor_on_);
	if(observer_) {
		observer_->set_led_status("Jasmin", on);
	}
}